

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

bool __thiscall ON_PointGrid::GetPoint(ON_PointGrid *this,int i,int j,ON_3dPoint *point)

{
  ON_3dPoint *pOVar1;
  bool local_21;
  bool rc;
  ON_3dPoint *point_local;
  int j_local;
  int i_local;
  ON_PointGrid *this_local;
  
  local_21 = false;
  if ((((-1 < i) && (i < this->m_point_count[0])) && (-1 < j)) && (j < this->m_point_count[1])) {
    pOVar1 = ON_SimpleArray<ON_3dPoint>::operator[]
                       (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,
                        i * this->m_point_stride0 + j);
    point->x = pOVar1->x;
    point->y = pOVar1->y;
    point->z = pOVar1->z;
    local_21 = true;
  }
  return local_21;
}

Assistant:

bool ON_PointGrid::GetPoint( int i, int j, ON_3dPoint& point ) const
{
  bool rc = false;
  if ( 0 <= i && i < m_point_count[0] && 0 <= j && j < m_point_count[1] ) {
    point = m_point[i*m_point_stride0+j];
    rc = true;
  }
  return rc;
}